

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O2

TransactionController * __thiscall
cfd::api::TransactionApi::FundRawTransaction
          (TransactionController *__return_storage_ptr__,TransactionApi *this,string *tx_hex,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos,Amount *target_value,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *selected_txin_utxos,
          string *reserve_txout_address,double effective_fee_rate,Amount *estimate_fee,
          UtxoFilter *filter,CoinSelectionOption *option_params,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *append_txout_addresses,NetType_conflict net_type,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *prefix_list,Amount *calculate_fee)

{
  pointer *__x;
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pointer pUVar4;
  long lVar5;
  NetType_conflict type;
  pointer pTVar6;
  bool bVar7;
  Transaction *this_00;
  uint64_t uVar8;
  CfdException *pCVar9;
  Txid *txid_00;
  pointer pUVar10;
  pointer pUVar11;
  CoinSelectionOption *this_01;
  string *__return_storage_ptr___00;
  TxOutReference *txout;
  long lVar12;
  pointer pUVar13;
  Amount AVar14;
  Txid txid;
  Amount local_580;
  pointer local_570;
  double local_568;
  int64_t new_txout_satoshi;
  CoinSelection coin_select;
  Amount txin_total_amount;
  Amount target_amount;
  Amount local_4e0;
  Amount txout_amount;
  Amount txin_amount;
  UtxoFilter utxo_filter;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> selected_coins;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txid_bytes;
  Amount local_478;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxodata_list;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> local_450;
  undefined1 local_438 [32];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> matched_txin_utxos;
  Amount local_3e0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> new_selected_utxos;
  Amount local_3b8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3a8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxo_list;
  AddressFactory_conflict addr_factory;
  CoinSelectionOption option;
  Amount local_2e8;
  Address reserve_address;
  AbstractTxOutReference local_160;
  AbstractTxOutReference local_110;
  AbstractTxInReference local_c0;
  
  type = net_type;
  local_568 = effective_fee_rate;
  CoinSelectionOption::CoinSelectionOption(&option);
  if (filter != (UtxoFilter *)0x0) {
    utxo_filter = (UtxoFilter)filter->reserved;
  }
  if (option_params == (CoinSelectionOption *)0x0) {
    CoinSelectionOption::InitializeTxSizeInfo(&option);
    CoinSelectionOption::SetEffectiveFeeBaserate(&option,local_568);
    CoinSelectionOption::SetLongTermFeeBaserate(&option,local_568);
  }
  else {
    CoinSelectionOption::operator=(&option,option_params);
  }
  AddressFactory::AddressFactory((AddressFactory *)&addr_factory,type);
  if (prefix_list !=
      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0) {
    AddressFactory::AddressFactory((AddressFactory *)&reserve_address,type,prefix_list);
    AddressFactory::operator=((AddressFactory *)&addr_factory,(AddressFactory *)&reserve_address);
    AddressFactory::~AddressFactory((AddressFactory *)&reserve_address);
  }
  AddressFactory::GetAddress(&reserve_address,(AddressFactory *)&addr_factory,reserve_txout_address)
  ;
  bVar7 = AddressFactory::CheckAddressNetType((AddressFactory *)&addr_factory,&reserve_address,type)
  ;
  if (!bVar7) {
    coin_select._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
         + 0x61;
    coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ = 0x146;
    coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = anon_var_dwarf_608a65;
    txid._vptr_Txid = (_func_int **)CONCAT44(txid._vptr_Txid._4_4_,reserve_address.type_);
    core::logger::warn<std::__cxx11::string_const&,cfd::core::NetType&,cfd::core::NetType>
              ((CfdSourceLocation *)&coin_select,
               "Failed to FundRawTransaction. Input address and network is unmatch.: address=[{}], input_net_type=[{}], parsed_net_type=[{}]"
               ,reserve_txout_address,&net_type,(anon_enum_32 *)&txid);
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&coin_select,
               "Failed to FundRawTransaction. Input address and network is unmatch.",
               (allocator *)&txid);
    core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&coin_select);
    __cxa_throw(pCVar9,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  TransactionController::TransactionController(__return_storage_ptr__,tx_hex);
  this_00 = TransactionController::GetTransaction(__return_storage_ptr__);
  core::Amount::Amount(&txin_amount);
  core::Amount::Amount(&txout_amount);
  core::Transaction::GetTxOutList
            ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
             &coin_select,this_00);
  lVar5 = CONCAT44(coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                   coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_);
  for (lVar12 = coin_select._0_8_; lVar12 != lVar5; lVar12 = lVar12 + 0x50) {
    txid._vptr_Txid = *(_func_int ***)(lVar12 + 8);
    txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *(undefined1 *)(lVar12 + 0x10);
    core::Amount::operator+=(&txout_amount,(Amount *)&txid);
  }
  std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
            ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
             &coin_select);
  matched_txin_utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  matched_txin_utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  matched_txin_utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::reserve
            (&matched_txin_utxos,
             ((long)(selected_txin_utxos->
                    super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(selected_txin_utxos->
                   super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
                   super__Vector_impl_data._M_start) / 0x4f0);
  core::Transaction::GetTxInList(&local_450,this_00);
  pUVar4 = (selected_txin_utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pUVar13 = (selected_txin_utxos->
                 super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      pTVar6 = local_450.
               super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
               ._M_impl.super__Vector_impl_data._M_finish, pUVar13 != pUVar4; pUVar13 = pUVar13 + 1)
  {
    for (pUVar11 = (pointer)local_450.
                            super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                            ._M_impl.super__Vector_impl_data._M_start; pUVar11 != (pointer)pTVar6;
        pUVar11 = (pointer)(pUVar11->asset + 7)) {
      core::Txid::Txid((Txid *)&coin_select,(Txid *)pUVar11->block_hash);
      bVar7 = core::Txid::Equals((Txid *)&coin_select,&pUVar13->txid);
      if (bVar7) {
        local_570 = (pointer)CONCAT44(local_570._4_4_,pUVar13->vout);
        iVar1 = *(int *)pUVar11->txid;
        core::Txid::~Txid((Txid *)&coin_select);
        if ((int)local_570 == iVar1) {
          core::Amount::operator+=(&txin_amount,&pUVar13->amount);
          std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
                    (&matched_txin_utxos,pUVar13);
          break;
        }
      }
      else {
        core::Txid::~Txid((Txid *)&coin_select);
      }
    }
  }
  utxodata_list.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  utxodata_list.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  utxodata_list.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::reserve
            (&utxodata_list,
             ((long)(utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x4f0);
  pUVar4 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pUVar13 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
                 super__Vector_impl_data._M_start; pUVar13 != pUVar4; pUVar13 = pUVar13 + 1) {
    local_570 = (pointer)local_450.
                         super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    pUVar10 = (pointer)local_450.
                       super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    for (pUVar11 = (pointer)local_450.
                            super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                            ._M_impl.super__Vector_impl_data._M_start; pUVar11 != pUVar10;
        pUVar11 = (pointer)(pUVar11->asset + 7)) {
      core::Txid::Txid((Txid *)&coin_select,(Txid *)pUVar11->block_hash);
      bVar7 = core::Txid::Equals((Txid *)&coin_select,&pUVar13->txid);
      if (bVar7) {
        uVar2 = pUVar13->vout;
        uVar3 = *(uint32_t *)pUVar11->txid;
        core::Txid::~Txid((Txid *)&coin_select);
        pUVar10 = local_570;
        if (uVar2 == uVar3) goto LAB_00337d26;
      }
      else {
        core::Txid::~Txid((Txid *)&coin_select);
      }
    }
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back(&utxodata_list,pUVar13);
LAB_00337d26:
  }
  core::Amount::Amount(&local_580);
  this_01 = &option;
  uVar8 = CoinSelectionOption::GetEffectiveFeeBaserate(this_01);
  if (uVar8 != 0) {
    AVar14 = EstimateFee((TransactionApi *)this_01,tx_hex,&matched_txin_utxos,(Amount *)0x0,
                         (Amount *)0x0,local_568);
    local_580.amount_ = AVar14.amount_;
    local_580.ignore_check_ = AVar14.ignore_check_;
    coin_select._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
         + 0x61;
    coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ = 0x17d;
    coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = anon_var_dwarf_608a65;
    txid._vptr_Txid = (_func_int **)core::Amount::GetSatoshiValue(&local_580);
    core::logger::info<long>
              ((CfdSourceLocation *)&coin_select,"FundRawTransaction: pre estimation fee=[{}]",
               (long *)&txid);
  }
  core::Amount::Amount(&local_478);
  target_amount.amount_ = target_value->amount_;
  target_amount.ignore_check_ = target_value->ignore_check_;
  target_amount._9_7_ = *(undefined7 *)&target_value->field_0x9;
  bVar7 = core::operator>(&txin_amount,&txout_amount);
  if (bVar7) {
    AVar14 = core::operator-(&txin_amount,&txout_amount);
    local_478.amount_ = AVar14.amount_;
    local_478.ignore_check_ = AVar14.ignore_check_;
    bVar7 = core::operator<(&local_478,&target_amount);
    if (bVar7) {
      core::Amount::operator-=(&target_amount,&local_478);
    }
  }
  else {
    bVar7 = core::operator<(&txin_amount,&txout_amount);
    if (bVar7) {
      AVar14 = core::operator-(&txout_amount,&txin_amount);
      local_478.amount_ = AVar14.amount_;
      local_478.ignore_check_ = AVar14.ignore_check_;
      core::Amount::operator+=(&target_amount,&local_478);
    }
  }
  UtxoUtil::ConvertToUtxo(&utxo_list,&utxodata_list);
  txin_total_amount.amount_ = txin_amount.amount_;
  txin_total_amount.ignore_check_ = txin_amount.ignore_check_;
  txin_total_amount._9_7_ = txin_amount._9_7_;
  selected_coins.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  selected_coins.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  selected_coins.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar7 = core::operator>(&target_amount,0);
  if ((bVar7) || (bVar7 = core::operator>(&local_580,0), bVar7)) {
    coin_select._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
         + 0x61;
    coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ = 0x197;
    coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = anon_var_dwarf_608a65;
    txid._vptr_Txid = (_func_int **)core::Amount::GetSatoshiValue(&target_amount);
    core::logger::info<long>
              ((CfdSourceLocation *)&coin_select,
               "FundRawTransaction:CoinSelection: target_amount=[{}]",(long *)&txid);
    CoinSelection::CoinSelection(&coin_select);
    CoinSelection::SelectCoins
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&txid,&coin_select,&target_amount,
               &utxo_list,&utxo_filter,&option,&local_580,&txin_total_amount,(Amount *)0x0,
               (bool *)0x0);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::_M_move_assign(&selected_coins,&txid);
    std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
              ((_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&txid);
    core::Amount::operator+=(&txin_total_amount,&txin_amount);
    txid._vptr_Txid = (_func_int **)0x4f90cd;
    txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x19f;
    txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "FundRawTransaction";
    local_438._0_8_ = core::Amount::GetSatoshiValue(&txin_total_amount);
    core::logger::info<long>
              ((CfdSourceLocation *)&txid,"FundRawTransaction: txin_total_amount=[{}]",
               (long *)local_438);
    bVar7 = core::operator<(&txin_total_amount,&target_amount);
    if (bVar7) {
      txid._vptr_Txid = (_func_int **)0x4f90cd;
      txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x1a2;
      txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "FundRawTransaction";
      core::logger::warn<>((CfdSourceLocation *)&txid,"Failed to FundRawTransaction. low BTC.");
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&txid,"low BTC.",(allocator *)local_438);
      core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&txid);
      __cxa_throw(pCVar9,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>);
  }
  AVar14 = CoinSelectionOption::GetDustFeeAmount(&option,&reserve_address);
  local_3e0.amount_ = AVar14.amount_;
  local_3e0.ignore_check_ = AVar14.ignore_check_;
  coin_select._0_8_ =
       (long)
       "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
       + 0x61;
  coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ = 0x1aa;
  coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = anon_var_dwarf_608a65;
  txid._vptr_Txid = (_func_int **)core::Amount::GetSatoshiValue(&local_3e0);
  core::logger::info<long>
            ((CfdSourceLocation *)&coin_select,"FundRawTransaction: dust_amount=[{}]",(long *)&txid)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txid_bytes,0x20,
             (allocator_type *)&coin_select);
  AVar14 = core::operator-(&txin_total_amount,&txout_amount);
  local_4e0.amount_ = AVar14.amount_;
  local_4e0.ignore_check_ = AVar14.ignore_check_;
  new_txout_satoshi = core::Amount::GetSatoshiValue(&local_4e0);
  uVar8 = CoinSelectionOption::GetEffectiveFeeBaserate(&option);
  if (uVar8 != 0) {
    AVar14 = core::operator+(&txout_amount,&local_580);
    local_3b8.amount_ = AVar14.amount_;
    local_3b8.ignore_check_ = AVar14.ignore_check_;
    AVar14 = core::operator-(&txin_total_amount,&local_3e0);
    local_2e8.amount_ = AVar14.amount_;
    local_2e8.ignore_check_ = AVar14.ignore_check_;
    bVar7 = core::operator>(&local_2e8,&local_3b8);
    if (bVar7) {
      TransactionController::TransactionController((TransactionController *)&coin_select,tx_hex);
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
                (&new_selected_utxos,&matched_txin_utxos);
      core::Txid::Txid(&txid);
      local_570 = selected_coins.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      for (pUVar11 = selected_coins.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                     _M_impl.super__Vector_impl_data._M_start; pUVar11 != local_570;
          pUVar11 = pUVar11 + 1) {
        memcpy(txid_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,pUVar11->txid,
               (long)txid_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)txid_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        core::ByteData256::ByteData256((ByteData256 *)&local_3a8,&txid_bytes);
        core::Txid::Txid((Txid *)local_438,(ByteData256 *)&local_3a8);
        core::Txid::operator=(&txid,(Txid *)local_438);
        core::Txid::~Txid((Txid *)local_438);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3a8);
        pUVar13 = utxodata_list.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        txid_00 = &(utxodata_list.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                    _M_impl.super__Vector_impl_data._M_start)->txid;
        while (__x = &txid_00[-2].data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage, (pointer)__x != pUVar13) {
          bVar7 = core::Txid::Equals(&txid,txid_00);
          if ((bVar7) && (pUVar11->vout == *(uint32_t *)&txid_00[1]._vptr_Txid)) {
            std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
                      (&new_selected_utxos,(value_type *)__x);
            break;
          }
          txid_00 = (Txid *)&txid_00[0x27].data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      TransactionController::AddTxOut
                ((TxOutReference *)&local_110,(TransactionController *)&coin_select,&reserve_address
                 ,&local_580);
      core::AbstractTxOutReference::~AbstractTxOutReference(&local_110);
      __return_storage_ptr___00 = (string *)local_438;
      AbstractTransactionController::GetHex_abi_cxx11_
                (__return_storage_ptr___00,(AbstractTransactionController *)&coin_select);
      AVar14 = EstimateFee((TransactionApi *)__return_storage_ptr___00,(string *)local_438,
                           &new_selected_utxos,(Amount *)0x0,(Amount *)0x0,local_568);
      local_580.amount_ = AVar14.amount_;
      local_580.ignore_check_ = AVar14.ignore_check_;
      std::__cxx11::string::~string((string *)local_438);
      local_438._0_8_ = "cfdapi_transaction.cpp";
      local_438._8_4_ = 0x1cc;
      local_438._16_8_ = "FundRawTransaction";
      local_3a8._M_impl.super__Vector_impl_data._M_start =
           (pointer)core::Amount::GetSatoshiValue(&local_580);
      core::logger::info<long>
                ((CfdSourceLocation *)local_438,"FundRawTransaction: new_fee={}",(long *)&local_3a8)
      ;
      core::Txid::~Txid(&txid);
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&new_selected_utxos);
      TransactionController::~TransactionController((TransactionController *)&coin_select);
    }
    core::Amount::operator-=(&local_4e0,&local_580);
    new_txout_satoshi = core::Amount::GetSatoshiValue(&local_4e0);
    bVar7 = core::operator<(&txin_total_amount,&local_4e0);
    if (bVar7) {
      coin_select._0_8_ =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
           + 0x61;
      coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ = 0x1d4;
      coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = anon_var_dwarf_608a65;
      core::logger::warn<>
                ((CfdSourceLocation *)&coin_select,"Failed to FundRawTransaction. low fee.");
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&coin_select,"Failed to FundRawTransaction. low fee.",(allocator *)&txid)
      ;
      core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&coin_select);
      __cxa_throw(pCVar9,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if (calculate_fee != (Amount *)0x0) {
      calculate_fee->ignore_check_ = local_580.ignore_check_;
      calculate_fee->amount_ = local_580.amount_;
    }
    bVar7 = core::operator>(&local_3e0,&local_4e0);
    if (bVar7) {
      new_txout_satoshi = 0;
      AVar14 = core::operator-(&txin_total_amount,&local_4e0);
      local_580.amount_ = AVar14.amount_;
      local_580.ignore_check_ = AVar14.ignore_check_;
    }
    coin_select._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
         + 0x61;
    coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ = 0x1e2;
    coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = anon_var_dwarf_608a65;
    core::logger::info<long&>
              ((CfdSourceLocation *)&coin_select,"FundRawTransaction: new_txout_amount={}",
               &new_txout_satoshi);
  }
  if ((new_txout_satoshi != 0) && (bVar7 = core::operator<(&local_3e0,&local_4e0), bVar7)) {
    TransactionController::AddTxOut
              ((TxOutReference *)&local_160,__return_storage_ptr__,&reserve_address,&local_4e0);
    core::AbstractTxOutReference::~AbstractTxOutReference(&local_160);
    coin_select._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
         + 0x61;
    coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ = 0x1eb;
    coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = anon_var_dwarf_608a65;
    txid._vptr_Txid = (_func_int **)core::Amount::GetSatoshiValue(&local_478);
    core::logger::info<long>
              ((CfdSourceLocation *)&coin_select,"FundRawTransaction:AddTxOut: value=[{}]",
               (long *)&txid);
    if (append_txout_addresses !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(append_txout_addresses,reserve_txout_address);
    }
  }
  pUVar11 = selected_coins.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (estimate_fee != (Amount *)0x0) {
    estimate_fee->ignore_check_ = local_580.ignore_check_;
    estimate_fee->amount_ = local_580.amount_;
  }
  for (pUVar10 = selected_coins.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                 super__Vector_impl_data._M_start; pUVar10 != pUVar11; pUVar10 = pUVar10 + 1) {
    memcpy(txid_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,pUVar10->txid,
           (long)txid_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)txid_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    core::ByteData256::ByteData256((ByteData256 *)&txid,&txid_bytes);
    core::Txid::Txid((Txid *)&coin_select,(ByteData256 *)&txid);
    TransactionController::AddTxIn
              ((TxInReference *)&local_c0,__return_storage_ptr__,(Txid *)&coin_select,pUVar10->vout)
    ;
    core::AbstractTxInReference::~AbstractTxInReference(&local_c0);
    core::Txid::~Txid((Txid *)&coin_select);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txid);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&txid_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&selected_coins.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&utxo_list.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxodata_list);
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
            (&local_450);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&matched_txin_utxos);
  core::Address::~Address(&reserve_address);
  AddressFactory::~AddressFactory((AddressFactory *)&addr_factory);
  core::ConfidentialAssetId::~ConfidentialAssetId(&option.fee_asset_);
  return __return_storage_ptr__;
}

Assistant:

TransactionController TransactionApi::FundRawTransaction(
    const std::string& tx_hex, const std::vector<UtxoData>& utxos,
    const Amount& target_value,
    const std::vector<UtxoData>& selected_txin_utxos,
    const std::string& reserve_txout_address, double effective_fee_rate,
    Amount* estimate_fee, const UtxoFilter* filter,
    const CoinSelectionOption* option_params,
    std::vector<std::string>* append_txout_addresses, NetType net_type,
    const std::vector<AddressFormatData>* prefix_list,
    Amount* calculate_fee) const {
  // set option
  CoinSelectionOption option;
  UtxoFilter utxo_filter;
  if (filter) utxo_filter = *filter;
  if (option_params) {
    option = *option_params;
  } else {
    option.InitializeTxSizeInfo();
    option.SetEffectiveFeeBaserate(effective_fee_rate);
    option.SetLongTermFeeBaserate(effective_fee_rate);
  }

  AddressFactory addr_factory(net_type);
  if (prefix_list) {
    addr_factory = AddressFactory(net_type, *prefix_list);
  }
  Address reserve_address = addr_factory.GetAddress(reserve_txout_address);
  // FIXME(fujita-cg): AddressFactory::GetAddress()でチェックをしたいが、
  //   影響範囲が大きいためAPIでチェックを実行
  if (!addr_factory.CheckAddressNetType(reserve_address, net_type)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to FundRawTransaction. "
        "Input address and network is unmatch."
        ": address=[{}], input_net_type=[{}], parsed_net_type=[{}]",
        reserve_txout_address, net_type, reserve_address.GetNetType());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to FundRawTransaction. "
        "Input address and network is unmatch.");
  }

  // txから設定済みTxIn/TxOutの額を収集
  // (selected_txin_utxos指定分はtxid一致なら設定済みUTXO扱い)
  TransactionController txc(tx_hex);
  const Transaction& tx = txc.GetTransaction();
  Amount txin_amount;
  Amount txout_amount;
  for (const auto& txout : tx.GetTxOutList()) {
    txout_amount += txout.GetValue();
  }
  std::vector<UtxoData> matched_txin_utxos;
  matched_txin_utxos.reserve(selected_txin_utxos.size());
  const auto& txin_list = tx.GetTxInList();
  for (const auto& utxo : selected_txin_utxos) {
    for (const auto& txin : txin_list) {
      if ((txin.GetTxid().Equals(utxo.txid)) &&
          (utxo.vout == txin.GetVout())) {
        txin_amount += utxo.amount;
        matched_txin_utxos.push_back(utxo);
        break;
      }
    }
  }

  std::vector<UtxoData> utxodata_list;
  utxodata_list.reserve(utxos.size());
  for (const auto& utxo : utxos) {
    bool isFind = false;
    for (const auto& txin : txin_list) {
      if ((txin.GetTxid().Equals(utxo.txid)) &&
          (utxo.vout == txin.GetVout())) {
        isFind = true;
        break;
      }
    }
    if (!isFind) {
      utxodata_list.push_back(utxo);
    }
  }

  Amount fee;
  if (option.GetEffectiveFeeBaserate() != 0) {
    fee = EstimateFee(
        tx_hex, matched_txin_utxos, nullptr, nullptr, effective_fee_rate);
    info(
        CFD_LOG_SOURCE, "FundRawTransaction: pre estimation fee=[{}]",
        fee.GetSatoshiValue());
  }

  Amount diff_amount = Amount();        // difference between input and output
  Amount target_amount = target_value;  // selection require amount
  if (txin_amount > txout_amount) {
    // txinの余剰分を計算
    diff_amount = txin_amount - txout_amount;
    if (diff_amount < target_amount) {
      // txinの余剰分でtarget分が満たされない場合、満たされない分をコインセレクト
      target_amount -= diff_amount;
    }
  } else if (txin_amount < txout_amount) {
    // txoutの不足分を計算
    diff_amount = txout_amount - txin_amount;
    // txoutの不足分を合わせてコインセレクト
    target_amount += diff_amount;
  }

  // execute coinselection
  std::vector<Utxo> utxo_list = UtxoUtil::ConvertToUtxo(utxodata_list);
  Amount txin_total_amount = txin_amount;
  std::vector<Utxo> selected_coins;
  if (target_amount > 0 || fee > 0) {
    info(
        CFD_LOG_SOURCE, "FundRawTransaction:CoinSelection: target_amount=[{}]",
        target_amount.GetSatoshiValue());
    CoinSelection coin_select;
    selected_coins = coin_select.SelectCoins(
        target_amount, utxo_list, utxo_filter, option, fee, &txin_total_amount,
        nullptr, nullptr);
    txin_total_amount += txin_amount;
    info(
        CFD_LOG_SOURCE, "FundRawTransaction: txin_total_amount=[{}]",
        txin_total_amount.GetSatoshiValue());
    if (txin_total_amount < target_amount) {
      warn(CFD_LOG_SOURCE, "Failed to FundRawTransaction. low BTC.");
      throw CfdException(CfdError::kCfdIllegalArgumentError, "low BTC.");
    }
  }

  // dust_amountを計算
  Amount dust_amount = option.GetDustFeeAmount(reserve_address);
  info(
      CFD_LOG_SOURCE, "FundRawTransaction: dust_amount=[{}]",
      dust_amount.GetSatoshiValue());

  // txoutへの追加
  std::vector<uint8_t> txid_bytes(cfd::core::kByteData256Length);
  Amount new_txout_amount =
      txin_total_amount -
      txout_amount;  // diff_amount: selected + txin - txout = new txout amount
  int64_t new_txout_satoshi = new_txout_amount.GetSatoshiValue();
  // feeを考慮する場合、追加後のTxInが既存のTxOut額以上ある場合、TxOutが追加されるのでfeeを再計算
  if (option.GetEffectiveFeeBaserate() > 0) {
    Amount need_amount = txout_amount + fee;
    Amount check_amount = txin_total_amount - dust_amount;
    if (check_amount > need_amount) {
      // dummyのtx作成
      TransactionController txc_dummy(tx_hex);
      std::vector<UtxoData> new_selected_utxos = matched_txin_utxos;
      Txid txid;
      for (const Utxo& coin : selected_coins) {
        memcpy(txid_bytes.data(), coin.txid, txid_bytes.size());
        txid = Txid(ByteData256(txid_bytes));
        for (const UtxoData& utxo : utxodata_list) {
          if (txid.Equals(utxo.txid) && (coin.vout == utxo.vout)) {
            new_selected_utxos.push_back(utxo);
            break;
          }
        }
      }
      // ダミーへの追加のため額はfeeで代替
      txc_dummy.AddTxOut(reserve_address, fee);
      fee = EstimateFee(
          txc_dummy.GetHex(), new_selected_utxos, nullptr, nullptr,
          effective_fee_rate);
      info(
          CFD_LOG_SOURCE, "FundRawTransaction: new_fee={}",
          fee.GetSatoshiValue());
    }

    new_txout_amount -= fee;  // txoutの追加額からfee分を除外
    new_txout_satoshi = new_txout_amount.GetSatoshiValue();

    if (txin_total_amount < new_txout_amount) {
      warn(CFD_LOG_SOURCE, "Failed to FundRawTransaction. low fee.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to FundRawTransaction. low fee.");
    }

    if (calculate_fee != nullptr) *calculate_fee = fee;
    // optionで、超過額の設定がある場合、余剰分をfeeに設定。
    if (dust_amount > new_txout_amount) {
      // feeに残高をすべて設定
      new_txout_satoshi = 0;
      fee = txin_total_amount - new_txout_amount;
    }
    info(
        CFD_LOG_SOURCE, "FundRawTransaction: new_txout_amount={}",
        new_txout_satoshi);
  }

  // dustより小さい場合はTxOutには追加しない
  // (fee計算ありの場合はチェック済だが、fee計算なしの場合は未チェックのため)
  if ((new_txout_satoshi != 0) && (dust_amount < new_txout_amount)) {
    txc.AddTxOut(reserve_address, new_txout_amount);
    info(
        CFD_LOG_SOURCE, "FundRawTransaction:AddTxOut: value=[{}]",
        diff_amount.GetSatoshiValue());
    if (append_txout_addresses) {
      append_txout_addresses->push_back(reserve_txout_address);
    }
  }
  if (estimate_fee) *estimate_fee = fee;

  // SelectしたUTXOをTxInに設定
  for (auto& utxo : selected_coins) {
    memcpy(txid_bytes.data(), utxo.txid, txid_bytes.size());
    txc.AddTxIn(Txid(ByteData256(txid_bytes)), utxo.vout);
  }

  return txc;
}